

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Approvals.h
# Opt level: O1

void ApprovalTests::TApprovals<ApprovalTests::ToStringCompileTimeOptions<CustomToStringClass>>::
     verify<TemplatePrintable,int>(TemplatePrintable *contents,Options *options)

{
  uchar *in_RCX;
  size_t siglen;
  size_t in_R8;
  string local_30;
  
  CustomToStringClass::toString<TemplatePrintable>(&local_30,contents);
  TApprovals<ApprovalTests::ToStringCompileTimeOptions<CustomToStringClass>_>::verify
            ((EVP_PKEY_CTX *)&local_30,(uchar *)options,siglen,in_RCX,in_R8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void verify(const T& contents, const Options& options = Options())
        {
            verify(TCompileTimeOptions::ToStringConverter::toString(contents), options);
        }